

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.c
# Opt level: O0

int skip_to_next_token(void)

{
  FILE *__stream;
  ushort *puVar1;
  int iVar2;
  int iVar3;
  ushort **ppuVar4;
  int c;
  FILE *fp;
  InputFile *f;
  
  while( true ) {
    if (file_stack_ptr < 1) {
      return -1;
    }
    iVar2 = file_stack_ptr + -1;
    __stream = (FILE *)file_stack[iVar2].fp;
    while( true ) {
      while( true ) {
        ppuVar4 = __ctype_b_loc();
        puVar1 = *ppuVar4;
        iVar3 = fgetc(__stream);
        if ((puVar1[iVar3] & 0x2000) == 0) break;
        if (iVar3 == 10) {
          file_stack[iVar2].lineno = file_stack[iVar2].lineno + 1;
        }
      }
      if (iVar3 != 0x3b) break;
      do {
        iVar3 = getc(__stream);
      } while (iVar3 != 10 && iVar3 != -1);
      if (iVar3 == 10) {
        file_stack[iVar2].lineno = file_stack[iVar2].lineno + 1;
      }
    }
    if (iVar3 != -1) break;
    close_file();
  }
  return iVar3;
}

Assistant:

int
skip_to_next_token ()
{
  InputFile *f;
  FILE *fp;
  int c;

  /* Skip leading whitespace & handle EOF by popping up one file. */
  while (1)
    {
      if (file_stack_ptr <= 0)
	return EOF;

      f = &file_stack[file_stack_ptr - 1];
      fp = f->fp;

      /* Skip leading spaces & comments */
      while (1)
	{
	  while (isspace (c = fgetc (fp)))  /* Linux dies if you use getc. */
	    if (c == '\n') f->lineno++;
	  
	  if (c == ';')    /* Skip over comments */
	    {
	      while ((c = getc (fp)) != '\n' && c != EOF);
	      if (c == '\n') f->lineno++;
	    }
	  else break;
	}
  
      if (c == EOF)
	close_file ();
      else break;
    }

  return c;
}